

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::BooleanBitVectorFunction::BooleanBitVectorFunction
          (BooleanBitVectorFunction *this,KnownSystemName knownNameId,BVFKind kind)

{
  undefined4 in_EDX;
  undefined8 *in_RDI;
  SubroutineKind in_stack_00000028;
  KnownSystemName in_stack_0000002c;
  SystemSubroutine *in_stack_00000030;
  
  SystemSubroutine::SystemSubroutine(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  *in_RDI = &PTR__BooleanBitVectorFunction_00ff35b8;
  *(undefined4 *)(in_RDI + 7) = in_EDX;
  return;
}

Assistant:

BooleanBitVectorFunction(KnownSystemName knownNameId, BVFKind kind) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), kind(kind) {}